

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BSTreeTest.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  int iVar1;
  BSTree<int> *this;
  BSTNode<int> *pBVar2;
  long *plVar3;
  BSTNode<int> *pBVar4;
  int *item;
  pointer piVar5;
  initializer_list<int> __l;
  vector<int,_std::allocator<int>_> data;
  allocator_type local_61;
  vector<int,_std::allocator<int>_> local_60;
  int local_48 [10];
  
  local_48[4] = 2;
  local_48[5] = 7;
  local_48[6] = 6;
  local_48[7] = 8;
  local_48[0] = 1;
  local_48[1] = 5;
  local_48[2] = 4;
  local_48[3] = 3;
  __l._M_len = 8;
  __l._M_array = local_48;
  std::vector<int,_std::allocator<int>_>::vector(&local_60,__l,&local_61);
  this = (BSTree<int> *)operator_new(8);
  this->mRoot = (BSTNode<int> *)0x0;
  for (piVar5 = local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
      piVar5 != local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish; piVar5 = piVar5 + 1) {
    iVar1 = *piVar5;
    pBVar2 = (BSTNode<int> *)operator_new(0x20);
    pBVar2->key = iVar1;
    pBVar2->parent = (BSTNode<int> *)0x0;
    pBVar2->left = (BSTNode<int> *)0x0;
    pBVar2->right = (BSTNode<int> *)0x0;
    BSTree<int>::insert(this,(BSTNode<int> **)this,pBVar2);
  }
  pBVar2 = this->mRoot;
  if (pBVar2 != (BSTNode<int> *)0x0) {
    BSTree<int>::print(this,pBVar2,pBVar2->key,0);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"====================================",0x24);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'h');
  std::ostream::put('h');
  std::ostream::flush();
  pBVar2 = this->mRoot;
  do {
    pBVar4 = pBVar2;
    if (pBVar4 == (BSTNode<int> *)0x0) goto LAB_001013d0;
    pBVar2 = pBVar4->right;
  } while (pBVar4->right != (BSTNode<int> *)0x0);
  if (pBVar4 != (BSTNode<int> *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"maxmum: ",8);
    pBVar2 = this->mRoot;
    do {
      pBVar4 = pBVar2;
      if (pBVar4 == (BSTNode<int> *)0x0) break;
      pBVar2 = pBVar4->right;
    } while (pBVar4->right != (BSTNode<int> *)0x0);
    plVar3 = (long *)std::ostream::operator<<((ostream *)&std::cout,pBVar4->key);
    std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
    std::ostream::put((char)plVar3);
    std::ostream::flush();
  }
LAB_001013d0:
  pBVar2 = this->mRoot;
  do {
    pBVar4 = pBVar2;
    if (pBVar4 == (BSTNode<int> *)0x0) goto LAB_0010144d;
    pBVar2 = pBVar4->left;
  } while (pBVar4->left != (BSTNode<int> *)0x0);
  if (pBVar4 != (BSTNode<int> *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"minimum: ",9);
    pBVar2 = this->mRoot;
    do {
      pBVar4 = pBVar2;
      if (pBVar4 == (BSTNode<int> *)0x0) break;
      pBVar2 = pBVar4->left;
    } while (pBVar4->left != (BSTNode<int> *)0x0);
    plVar3 = (long *)std::ostream::operator<<((ostream *)&std::cout,pBVar4->key);
    std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
    std::ostream::put((char)plVar3);
    std::ostream::flush();
  }
LAB_0010144d:
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"====================================",0x24);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'h');
  std::ostream::put('h');
  std::ostream::flush();
  BSTree<int>::preOrder(this,this->mRoot);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'h');
  std::ostream::put('h');
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"====================================",0x24);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'h');
  std::ostream::put('h');
  std::ostream::flush();
  BSTree<int>::inOrder(this,this->mRoot);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'h');
  std::ostream::put('h');
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"====================================",0x24);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'h');
  std::ostream::put('h');
  std::ostream::flush();
  BSTree<int>::postOrder(this,this->mRoot);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'h');
  std::ostream::put('h');
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"====================================",0x24);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'h');
  std::ostream::put('h');
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Test seach:",0xb);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'h');
  std::ostream::put('h');
  std::ostream::flush();
  pBVar2 = BSTree<int>::search(this,this->mRoot,3);
  plVar3 = (long *)std::ostream::operator<<((ostream *)&std::cout,pBVar2->key);
  std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
  std::ostream::put((char)plVar3);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"====================================",0x24);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'h');
  std::ostream::put('h');
  std::ostream::flush();
  BSTree<int>::remove(this,(char *)0x5);
  pBVar2 = this->mRoot;
  if (pBVar2 != (BSTNode<int> *)0x0) {
    BSTree<int>::print(this,pBVar2,pBVar2->key,0);
  }
  BSTree<int>::destroy(this,(BSTNode<int> **)this);
  operator_delete(this,8);
  if (local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return 0;
}

Assistant:

int main(int argc, char const *argv[])
{
	vector<int> data = {1, 5, 4, 3, 2, 7, 6, 8};
	BSTree<int>* tree =  new BSTree<int>();

	for (const auto& item : data)
		tree->insert(item);

	tree->print();

	cout << "====================================" << endl;
	if (tree->maxmum() != nullptr)
		cout << "maxmum: " << tree->maxmum()->key << endl;
	if (tree->minimum() != nullptr )
		cout << "minimum: " << tree->minimum()->key << endl;

	cout << "====================================" << endl;
	tree->preOrder();
	cout << endl;
	cout << "====================================" << endl;


	tree->inOrder();
	cout << endl;
	cout << "====================================" << endl;

	tree->postOrder();
	cout << endl;
	cout << "====================================" << endl;

	cout << "Test seach:" << endl;
	cout << tree->search(3)->key<< endl;
	cout << "====================================" << endl;

	tree->remove(5);
	tree->print();

	delete tree;

	return 0;
}